

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall slang::parsing::Lexer::lexTrivia<false>(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  TriviaKind local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
LAB_0041e6f0:
  pcVar2 = this->sourceBuffer;
  this->marker = pcVar2;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\t':
  case '\v':
  case '\f':
switchD_0041e70b_caseD_9:
    this->sourceBuffer = pcVar2 + 1;
    scanWhitespace(this);
    goto LAB_0041e6f0;
  case '\n':
    this->sourceBuffer = pcVar2 + 1;
    local_38._M_len = 1;
    break;
  case '\r':
    this->sourceBuffer = pcVar2 + 1;
    if (pcVar2[1] == '\n') {
      this->sourceBuffer = pcVar2 + 2;
    }
    local_38._M_len = (size_t)(uint)(*(int *)&this->sourceBuffer - (int)pcVar2);
    break;
  default:
    if (cVar1 != '/') {
      if (cVar1 != ' ') {
        return;
      }
      goto switchD_0041e70b_caseD_9;
    }
    if (pcVar2[1] == '/') {
      this->sourceBuffer = pcVar2 + 2;
      scanLineComment(this);
    }
    else {
      if (pcVar2[1] != '*') {
        return;
      }
      this->sourceBuffer = pcVar2 + 2;
      scanBlockComment(this);
    }
    goto LAB_0041e6f0;
  }
  local_39 = EndOfLine;
  local_38._M_str = pcVar2;
  SmallVectorBase<slang::parsing::Trivia>::
  emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
            (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,&local_39,&local_38
            );
  goto LAB_0041e6f0;
}

Assistant:

void Lexer::lexTrivia() {
    while (true) {
        mark();

        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                scanWhitespace();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        advance(2);
                        scanLineComment();
                        break;
                    case '*': {
                        advance(2);
                        scanBlockComment();
                        break;
                    }
                    default:
                        return;
                }
                break;
            case '\r':
                advance();
                consume('\n');
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            case '\n':
                advance();
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            default:
                return;
        }
    }
}